

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O1

string * __thiscall
google::protobuf::compiler::cpp::DefaultValue_abi_cxx11_
          (string *__return_storage_ptr__,cpp *this,Options *options,FieldDescriptor *field)

{
  float value;
  double value_00;
  once_flag *__once;
  Descriptor *this_00;
  long *plVar1;
  EnumDescriptor *this_01;
  EnumValueDescriptor *pEVar2;
  LogMessage *other;
  undefined8 *puVar3;
  long lVar4;
  uint *options_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  size_type *psVar6;
  int number;
  Options *extraout_RDX;
  Options *pOVar7;
  ulong uVar8;
  char *pcVar9;
  protobuf *ppVar10;
  cpp *this_02;
  char *pcVar11;
  undefined8 uVar12;
  _Alloc_hider _Var13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238 [2];
  undefined1 local_210 [48];
  string local_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b0;
  undefined1 local_1a0 [48];
  SubstituteArg local_170;
  SubstituteArg local_140;
  SubstituteArg local_110;
  SubstituteArg local_e0;
  SubstituteArg local_b0;
  SubstituteArg local_80;
  SubstituteArg local_50;
  
  ppVar10 = (protobuf *)&stack0xfffffffffffffdb8;
  __once = (once_flag *)(options->runtime_include_base)._M_dataplus._M_p;
  pOVar7 = options;
  this_02 = this;
  if (__once != (once_flag *)0x0) {
    local_210._0_8_ = options;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (__once,(_func_void_FieldDescriptor_ptr **)&stack0xfffffffffffffdb8,
               (FieldDescriptor **)local_210);
    pOVar7 = extraout_RDX;
    this_02 = (cpp *)ppVar10;
  }
  options_00 = &switchD_0022eded::switchdataD_00395bb8;
  switch(*(undefined4 *)
          (FieldDescriptor::kTypeToCppTypeMap +
          (ulong)(uint)(options->runtime_include_base)._M_string_length * 4)) {
  case 1:
    Int32ToString_abi_cxx11_
              (__return_storage_ptr__,
               (cpp *)(ulong)*(uint *)((long)&(options->annotation_guard_name).field_2 + 8),
               (int)pOVar7);
    return __return_storage_ptr__;
  case 2:
    uVar12 = local_238;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&stack0xfffffffffffffdb8,"PROTOBUF","");
    Int64ToString(__return_storage_ptr__,(string *)&stack0xfffffffffffffdb8,
                  *(int64 *)((long)&(options->annotation_guard_name).field_2 + 8));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)uVar12 == local_238) {
      return __return_storage_ptr__;
    }
    break;
  case 3:
    _Var13._M_p = (pointer)local_238;
    pcVar9 = FastUInt32ToBufferLeft
                       (*(uint32 *)((long)&(options->annotation_guard_name).field_2 + 8),
                        local_238[0]._M_local_buf);
    local_210._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)(local_210 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_210,_Var13._M_p,_Var13._M_p + ((long)pcVar9 - (long)local_238));
    plVar1 = (long *)std::__cxx11::string::append((char *)local_210);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar6 = (size_type *)(plVar1 + 2);
    if ((size_type *)*plVar1 == psVar6) {
      lVar4 = plVar1[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar4;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar1;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
    }
    __return_storage_ptr__->_M_string_length = plVar1[1];
    *plVar1 = (long)psVar6;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    uVar12 = local_210._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._0_8_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_210 + 0x10)) {
      return __return_storage_ptr__;
    }
    break;
  case 4:
    uVar12 = local_238;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&stack0xfffffffffffffdb8,"PROTOBUF","");
    UInt64ToString(__return_storage_ptr__,(string *)&stack0xfffffffffffffdb8,
                   *(uint64 *)((long)&(options->annotation_guard_name).field_2 + 8));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)uVar12 == local_238) {
      return __return_storage_ptr__;
    }
    break;
  case 5:
    value_00 = *(double *)((long)&(options->annotation_guard_name).field_2 + 8);
    if (value_00 < INFINITY) {
      if (-INFINITY < value_00) {
        if (!NAN(value_00)) {
          SimpleDtoa_abi_cxx11_(__return_storage_ptr__,(protobuf *)this_02,value_00);
          return __return_storage_ptr__;
        }
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar11 = "std::numeric_limits<double>::quiet_NaN()";
        pcVar9 = "";
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar11 = "-std::numeric_limits<double>::infinity()";
        pcVar9 = "";
      }
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar11 = "std::numeric_limits<double>::infinity()";
      pcVar9 = "";
    }
    goto LAB_0022f167;
  case 6:
    value = *(float *)((long)&(options->annotation_guard_name).field_2 + 8);
    if (value < INFINITY) {
      if (-INFINITY < value) {
        if (!NAN(value)) {
          SimpleFtoa_abi_cxx11_(__return_storage_ptr__,(protobuf *)this_02,value);
          lVar4 = std::__cxx11::string::find_first_of((char *)__return_storage_ptr__,0x39603f,0);
          if (lVar4 == -1) {
            return __return_storage_ptr__;
          }
          std::__cxx11::string::push_back((char)__return_storage_ptr__);
          return __return_storage_ptr__;
        }
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar11 = "std::numeric_limits<float>::quiet_NaN()";
        pcVar9 = "";
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar11 = "-std::numeric_limits<float>::infinity()";
        pcVar9 = "";
      }
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar11 = "std::numeric_limits<float>::infinity()";
      pcVar9 = "";
    }
    goto LAB_0022f167;
  case 7:
    uVar8 = (ulong)(byte)(options->annotation_guard_name).field_2._M_local_buf[8];
    pcVar11 = "false";
    if (uVar8 != 0) {
      pcVar11 = "true";
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar9 = pcVar11 + (uVar8 ^ 5);
    goto LAB_0022f167;
  case 8:
    this_01 = FieldDescriptor::enum_type((FieldDescriptor *)options);
    ClassName_abi_cxx11_
              ((string *)&local_1c0,(cpp *)this_01,(EnumDescriptor *)0x1,SUB81(options_00,0));
    uVar12 = local_1c0._M_allocated_capacity;
    pEVar2 = FieldDescriptor::default_value_enum((FieldDescriptor *)options);
    Int32ToString_abi_cxx11_(&local_1e0,(cpp *)(ulong)*(uint *)(pEVar2 + 0x10),number);
    local_210._0_8_ = local_1e0._M_dataplus._M_p;
    local_210._8_4_ = (int)local_1e0._M_string_length;
    local_1a0._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    local_1a0._8_4_ = -1;
    local_50.text_ = (char *)0x0;
    local_50.size_ = -1;
    local_80.text_ = (char *)0x0;
    local_80.size_ = -1;
    local_b0.text_ = (char *)0x0;
    local_b0.size_ = -1;
    local_e0.text_ = (char *)0x0;
    local_e0.size_ = -1;
    local_110.text_ = (char *)0x0;
    local_110.size_ = -1;
    local_140.text_ = (char *)0x0;
    local_140.size_ = -1;
    local_170.text_ = (char *)0x0;
    local_170.size_ = -1;
    strings::Substitute_abi_cxx11_
              (__return_storage_ptr__,(strings *)"static_cast< $0 >($1)",&stack0xfffffffffffffdb8,
               (SubstituteArg *)local_210,(SubstituteArg *)local_1a0,&local_50,&local_80,&local_b0,
               &local_e0,&local_110,&local_140,&local_170,(SubstituteArg *)uVar12);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
      operator_delete(local_1e0._M_dataplus._M_p);
    }
    uVar12 = local_1c0._M_allocated_capacity;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_allocated_capacity == &local_1b0) {
      return __return_storage_ptr__;
    }
    break;
  case 9:
    CEscape((string *)local_1a0,*(string **)((long)&(options->annotation_guard_name).field_2 + 8));
    EscapeTrigraphs((string *)local_210,(string *)local_1a0);
    puVar3 = (undefined8 *)std::__cxx11::string::replace((ulong)local_210,0,(char *)0x0,0x399884);
    paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(puVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar3 == paVar5) {
      local_238[0]._0_8_ = paVar5->_M_allocated_capacity;
      local_238[0]._8_8_ = puVar3[3];
      _Var13._M_p = (pointer)local_238;
    }
    else {
      local_238[0]._0_8_ = paVar5->_M_allocated_capacity;
      _Var13._M_p = (pointer)*puVar3;
    }
    *puVar3 = paVar5;
    puVar3[1] = 0;
    *(undefined1 *)(puVar3 + 2) = 0;
    plVar1 = (long *)std::__cxx11::string::append(&stack0xfffffffffffffdb8);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar6 = (size_type *)(plVar1 + 2);
    if ((size_type *)*plVar1 == psVar6) {
      lVar4 = plVar1[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar4;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar1;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
    }
    __return_storage_ptr__->_M_string_length = plVar1[1];
    *plVar1 = (long)psVar6;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var13._M_p != local_238) {
      operator_delete(_Var13._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_210 + 0x10)) {
      operator_delete((void *)local_210._0_8_);
    }
    uVar12 = local_1a0._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0._0_8_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_1a0 + 0x10)) {
      return __return_storage_ptr__;
    }
    break;
  case 10:
    this_00 = FieldDescriptor::message_type((FieldDescriptor *)options);
    QualifiedClassName_abi_cxx11_
              ((string *)local_210,(cpp *)this_00,(Descriptor *)this,(Options *)options_00);
    plVar1 = (long *)std::__cxx11::string::replace((ulong)local_210,0,(char *)0x0,0x393541);
    paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(plVar1 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar1 == paVar5) {
      local_238[0]._0_8_ = paVar5->_M_allocated_capacity;
      local_238[0]._8_8_ = plVar1[3];
      _Var13._M_p = (pointer)local_238;
    }
    else {
      local_238[0]._0_8_ = paVar5->_M_allocated_capacity;
      _Var13._M_p = (pointer)*plVar1;
    }
    *plVar1 = (long)paVar5;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    plVar1 = (long *)std::__cxx11::string::append(&stack0xfffffffffffffdb8);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar6 = (size_type *)(plVar1 + 2);
    if ((size_type *)*plVar1 == psVar6) {
      lVar4 = plVar1[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar4;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar1;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
    }
    __return_storage_ptr__->_M_string_length = plVar1[1];
    *plVar1 = (long)psVar6;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var13._M_p != local_238) {
      operator_delete(_Var13._M_p);
    }
    uVar12 = local_210._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._0_8_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_210 + 0x10)) {
      return __return_storage_ptr__;
    }
    break;
  default:
    internal::LogMessage::LogMessage
              ((LogMessage *)&stack0xfffffffffffffdb8,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/compiler/cpp/cpp_helpers.cc"
               ,0x2b5);
    other = internal::LogMessage::operator<<
                      ((LogMessage *)&stack0xfffffffffffffdb8,"Can\'t get here.");
    internal::LogFinisher::operator=((LogFinisher *)local_210,other);
    internal::LogMessage::~LogMessage((LogMessage *)&stack0xfffffffffffffdb8);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar9 = "";
    pcVar11 = "";
LAB_0022f167:
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar11,pcVar9)
    ;
    return __return_storage_ptr__;
  }
  operator_delete((void *)uVar12);
  return __return_storage_ptr__;
}

Assistant:

std::string DefaultValue(const Options& options, const FieldDescriptor* field) {
  switch (field->cpp_type()) {
    case FieldDescriptor::CPPTYPE_INT32:
      return Int32ToString(field->default_value_int32());
    case FieldDescriptor::CPPTYPE_UINT32:
      return StrCat(field->default_value_uint32()) + "u";
    case FieldDescriptor::CPPTYPE_INT64:
      return Int64ToString("PROTOBUF", field->default_value_int64());
    case FieldDescriptor::CPPTYPE_UINT64:
      return UInt64ToString("PROTOBUF", field->default_value_uint64());
    case FieldDescriptor::CPPTYPE_DOUBLE: {
      double value = field->default_value_double();
      if (value == std::numeric_limits<double>::infinity()) {
        return "std::numeric_limits<double>::infinity()";
      } else if (value == -std::numeric_limits<double>::infinity()) {
        return "-std::numeric_limits<double>::infinity()";
      } else if (value != value) {
        return "std::numeric_limits<double>::quiet_NaN()";
      } else {
        return SimpleDtoa(value);
      }
    }
    case FieldDescriptor::CPPTYPE_FLOAT: {
      float value = field->default_value_float();
      if (value == std::numeric_limits<float>::infinity()) {
        return "std::numeric_limits<float>::infinity()";
      } else if (value == -std::numeric_limits<float>::infinity()) {
        return "-std::numeric_limits<float>::infinity()";
      } else if (value != value) {
        return "std::numeric_limits<float>::quiet_NaN()";
      } else {
        std::string float_value = SimpleFtoa(value);
        // If floating point value contains a period (.) or an exponent
        // (either E or e), then append suffix 'f' to make it a float
        // literal.
        if (float_value.find_first_of(".eE") != string::npos) {
          float_value.push_back('f');
        }
        return float_value;
      }
    }
    case FieldDescriptor::CPPTYPE_BOOL:
      return field->default_value_bool() ? "true" : "false";
    case FieldDescriptor::CPPTYPE_ENUM:
      // Lazy:  Generate a static_cast because we don't have a helper function
      //   that constructs the full name of an enum value.
      return strings::Substitute(
          "static_cast< $0 >($1)", ClassName(field->enum_type(), true),
          Int32ToString(field->default_value_enum()->number()));
    case FieldDescriptor::CPPTYPE_STRING:
      return "\"" +
             EscapeTrigraphs(CEscape(field->default_value_string())) +
             "\"";
    case FieldDescriptor::CPPTYPE_MESSAGE:
      return "*" + FieldMessageTypeName(field, options) +
             "::internal_default_instance()";
  }
  // Can't actually get here; make compiler happy.  (We could add a default
  // case above but then we wouldn't get the nice compiler warning when a
  // new type is added.)
  GOOGLE_LOG(FATAL) << "Can't get here.";
  return "";
}